

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboRepeatedClearBlitTex2DCase::render
          (FboRepeatedClearBlitTex2DCase *this,Surface *dst)

{
  undefined1 local_c8 [8];
  Vec4 color;
  int cellX;
  int cellY;
  int local_a0;
  int fboNdx;
  deUint32 local_90 [2];
  deUint32 textures [2];
  deUint32 fbos [2];
  Random rnd;
  int fboSizes [2];
  int cellSize;
  int numRowsCols;
  TextureFormatInfo fmtInfo;
  TextureFormat fboFormat;
  Surface *dst_local;
  FboRepeatedClearBlitTex2DCase *this_local;
  
  fmtInfo.lookupBias.m_data._8_8_ =
       glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&cellSize,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  de::Random::Random((Random *)fbos,0x1153f3e);
  textures[0] = 0;
  textures[1] = 0;
  local_90[0] = 0;
  local_90[1] = 0;
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,2,textures);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,2,local_90);
  for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               textures[(long)local_a0 + -2]);
    sglr::ContextWrapper::glTexStorage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,1,
               (this->super_FboColorbufferCase).m_format,fboSizes[(long)local_a0 + -2],
               fboSizes[(long)local_a0 + -2]);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2600);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2600);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               textures[local_a0]);
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,0xde1,textures[(long)local_a0 + -2],0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cellX,0.0);
  FboTestCase::clearColorBuffer
            ((FboTestCase *)this,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),(Vec4 *)&cellX);
  for (color.m_data[3] = 0.0; (int)color.m_data[3] < 4;
      color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
    for (color.m_data[2] = 0.0; (int)color.m_data[2] < 4;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      randomVector<4>((Functional *)local_c8,(Random *)fbos,(Vector<float,_4> *)&cellSize,
                      (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2));
      sglr::ContextWrapper::glBindFramebuffer
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
                 textures[0]);
      FboTestCase::clearColorBuffer
                ((FboTestCase *)this,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),
                 (Vec4 *)local_c8);
      sglr::ContextWrapper::glBindFramebuffer
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8ca9,
                 textures[1]);
      sglr::ContextWrapper::glBlitFramebuffer
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,0x10,
                 0x10,(int)color.m_data[2] * 0x10,(int)color.m_data[3] * 0x10,
                 (int)color.m_data[2] * 0x10 + 0x10,(int)color.m_data[3] * 0x10 + 0x10,0x4000,0x2600
                );
    }
  }
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
             textures[1]);
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,0x40,0x40,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),
             (Vec4 *)(fmtInfo.valueMax.m_data + 2),(Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  FboTestCase::checkError((FboTestCase *)this);
  de::Random::~Random((Random *)fbos);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			glTexStorage2D(GL_TEXTURE_2D, 1, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbos[1]);
			glBlitFramebuffer(0, 0, cellSize, cellSize, cellX*cellSize, cellY*cellSize, (cellX+1)*cellSize, (cellY+1)*cellSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}